

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O0

void __thiscall Address::Address(Address *this)

{
  Address *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->city);
  std::__cxx11::string::string((string *)&this->street);
  std::__cxx11::string::operator=((string *)this,"");
  std::__cxx11::string::operator=((string *)&this->city,"");
  std::__cxx11::string::operator=((string *)&this->street,"");
  return;
}

Assistant:

Address::Address() {
     country="";
     city="";
     street="";

}